

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O0

void __thiscall kj::BufferedInputStreamWrapper::skip(BufferedInputStreamWrapper *this,size_t bytes)

{
  InputStream *this_00;
  size_t sVar1;
  void *pvVar2;
  void *pvVar3;
  uchar *puVar4;
  ArrayPtr<unsigned_char> AVar5;
  ArrayPtr<unsigned_char> local_50;
  uchar *local_40;
  size_t local_38;
  size_t local_30;
  size_t n;
  size_t local_20;
  void *local_18;
  size_t bytes_local;
  BufferedInputStreamWrapper *this_local;
  
  local_18 = (void *)bytes;
  bytes_local = (size_t)this;
  sVar1 = ArrayPtr<unsigned_char>::size(&this->bufferAvailable);
  pvVar2 = local_18;
  if (sVar1 < bytes) {
    sVar1 = ArrayPtr<unsigned_char>::size(&this->bufferAvailable);
    pvVar2 = (void *)((long)local_18 - sVar1);
    local_18 = pvVar2;
    pvVar3 = (void *)ArrayPtr<unsigned_char>::size(&this->buffer);
    if (pvVar3 < pvVar2) {
      ArrayPtr<unsigned_char>::ArrayPtr(&local_50,(void *)0x0);
      (this->bufferAvailable).ptr = local_50.ptr;
      (this->bufferAvailable).size_ = local_50.size_;
      (*this->inner->_vptr_InputStream[3])(this->inner,local_18);
    }
    else {
      this_00 = this->inner;
      puVar4 = ArrayPtr<unsigned_char>::begin(&this->buffer);
      pvVar2 = local_18;
      sVar1 = ArrayPtr<unsigned_char>::size(&this->buffer);
      local_30 = InputStream::read(this_00,(int)puVar4,pvVar2,sVar1);
      AVar5 = ArrayPtr<unsigned_char>::slice(&this->buffer,(size_t)local_18,local_30);
      local_40 = AVar5.ptr;
      (this->bufferAvailable).ptr = local_40;
      local_38 = AVar5.size_;
      (this->bufferAvailable).size_ = local_38;
    }
  }
  else {
    sVar1 = ArrayPtr<unsigned_char>::size(&this->bufferAvailable);
    AVar5 = ArrayPtr<unsigned_char>::slice(&this->bufferAvailable,(size_t)pvVar2,sVar1);
    n = (size_t)AVar5.ptr;
    (this->bufferAvailable).ptr = (uchar *)n;
    local_20 = AVar5.size_;
    (this->bufferAvailable).size_ = local_20;
  }
  return;
}

Assistant:

void BufferedInputStreamWrapper::skip(size_t bytes) {
  if (bytes <= bufferAvailable.size()) {
    bufferAvailable = bufferAvailable.slice(bytes, bufferAvailable.size());
  } else {
    bytes -= bufferAvailable.size();
    if (bytes <= buffer.size()) {
      // Read the next buffer-full.
      size_t n = inner.read(buffer.begin(), bytes, buffer.size());
      bufferAvailable = buffer.slice(bytes, n);
    } else {
      // Forward large skip to the underlying stream.
      bufferAvailable = nullptr;
      inner.skip(bytes);
    }
  }
}